

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_action.hpp
# Opt level: O0

bool __thiscall
cpp_properties::
properties_action<boost::property_tree::properties_parser::properties_actor<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,char>>
::operator()(properties_action<boost::property_tree::properties_parser::properties_actor<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,char>>
             *this,token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
                   *token)

{
  id_type iVar1;
  cpp_properties *pcVar2;
  property_type *ppVar3;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *latin1_string;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *sequence;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *code_point;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *latin1_string_00;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *sequence_00;
  iterator_range<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *code_point_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
  *local_18;
  token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
  *token_local;
  properties_action<boost::property_tree::properties_parser::properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>_>
  *this_local;
  
  local_18 = token;
  token_local = (token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
                 *)this;
  iVar1 = boost::spirit::lex::lexertl::
          token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
          ::id((token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                *)token);
  switch(iVar1) {
  case 0x3f6:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    latin1_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_38,pcVar2,latin1_string);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)ppVar3,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case 0x3f7:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    escape_sequence_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_68,pcVar2,sequence);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)ppVar3,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case 0x3f8:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    decode_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_88,pcVar2,code_point);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)ppVar3,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case 0x3fa:
  case 0x3fb:
  case 0x3fc:
  case 0x403:
  case 0x404:
  case 0x405:
    boost::property_tree::properties_parser::
    properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
    ::push_back(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                  **)this);
    break;
  case 0x400:
  case 0x401:
    boost::property_tree::properties_parser::
    properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
    ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                **)this);
    break;
  case 0x409:
  case 0x40a:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    latin1_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_a8,pcVar2,latin1_string_00);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)&ppVar3->second,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    break;
  case 0x40b:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    escape_sequence_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_c8,pcVar2,sequence_00);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)&ppVar3->second,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    break;
  case 0x40c:
    pcVar2 = (cpp_properties *)
             boost::spirit::lex::lexertl::
             token<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
             ::value(local_18);
    decode_to_utf8<boost::spirit::classic::position_iterator2<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,boost::spirit::classic::file_position_base<std::__cxx11::string>>,char>
              (&local_e8,pcVar2,code_point_00);
    ppVar3 = boost::property_tree::properties_parser::
             properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
             ::current(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                         **)this);
    std::__cxx11::string::operator+=((string *)&ppVar3->second,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    break;
  case 0x40e:
  case 0x40f:
  case 0x410:
    boost::property_tree::properties_parser::
    properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
    ::push_back(*(properties_actor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                  **)this);
  }
  return true;
}

Assistant:

bool operator()(Token const &token) const {
    using namespace token;
    switch (token.id()) {
    case ID_KEY_CHARS:
      actor.current().first += latin1_to_utf8(token.value());
      break;
    case ID_KEY_ESCAPE_CHAR:
      actor.current().first += escape_sequence_to_utf8(token.value());
      break;
    case ID_KEY_UNICODE:
      actor.current().first += decode_to_utf8(token.value());
      break;
    case ID_KEY_CR:
    case ID_KEY_LF:
    case ID_KEY_EOL:
    case ID_SEPARATOR_CR:
    case ID_SEPARATOR_LF:
    case ID_SEPARATOR_EOL:
      actor.push_back();
      break;
    case ID_SEPARATOR_EQUAL:
    case ID_SEPARATOR_COLON:
      // force initialization for useless empty key/value case
      actor.current();
      break;
    case ID_VALUE_SPACES:
    case ID_VALUE_CHARS:
      actor.current().second += latin1_to_utf8(token.value());
      break;
    case ID_VALUE_ESCAPE_CHAR:
      actor.current().second += escape_sequence_to_utf8(token.value());
      break;
    case ID_VALUE_UNICODE:
      actor.current().second += decode_to_utf8(token.value());
      break;
    case ID_VALUE_CR:
    case ID_VALUE_LF:
    case ID_VALUE_EOL:
      actor.push_back();
      break;
    }

    // always continue to tokenize
    return true;
  }